

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_rkvstore_create_instance.cc
# Opt level: O2

int __thiscall
aliyun::Rkvstore::CreateInstance
          (Rkvstore *this,RkvstoreCreateInstanceRequestType *req,
          RkvstoreCreateInstanceResponseType *response,RkvstoreErrorInfo *error_info)

{
  bool bVar1;
  int iVar2;
  Int IVar3;
  AliRpcRequest *this_00;
  Value *pVVar4;
  char *pcVar5;
  allocator<char> local_5e1;
  Value val;
  string local_5c8;
  allocator<char> local_5a3;
  allocator<char> local_5a2;
  allocator<char> local_5a1;
  string str_response;
  string local_580;
  string local_560;
  string local_540;
  string local_520;
  string local_500;
  string local_4e0;
  string local_4c0;
  string local_4a0;
  string local_480;
  string local_460;
  string local_440;
  string local_420;
  string local_400;
  string local_3e0;
  string local_3c0;
  string local_3a0;
  string local_380;
  string local_360;
  string local_340;
  string local_320;
  string local_300;
  string local_2e0;
  string local_2c0;
  string local_2a0;
  string local_280;
  string local_260;
  string local_240;
  string local_220;
  string local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  string local_1c0;
  string local_1a0;
  string local_180;
  string secheme;
  Reader reader;
  
  str_response._M_dataplus._M_p = (pointer)&str_response.field_2;
  str_response._M_string_length = 0;
  str_response.field_2._M_local_buf[0] = '\0';
  pcVar5 = "http";
  if (this->use_tls_ != false) {
    pcVar5 = "https";
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&secheme,pcVar5,(allocator<char> *)&reader);
  this_00 = (AliRpcRequest *)operator_new(0x2c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_180,this->version_,(allocator<char> *)&local_5c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a0,this->appid_,(allocator<char> *)&val);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c0,this->secret_,&local_5e1);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&reader,
                 &secheme,"://");
  std::operator+(&local_1e0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&reader,
                 this->host_);
  AliRpcRequest::AliRpcRequest(this_00,&local_180,&local_1a0,&local_1c0,&local_1e0);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&reader);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::__cxx11::string::~string((string *)&local_180);
  if (((this->use_tls_ == false) && (pcVar5 = this->proxy_host_, pcVar5 != (char *)0x0)) &&
     (*pcVar5 != '\0')) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_200,pcVar5,(allocator<char> *)&reader);
    AliHttpRequest::SetHttpProxy((AliHttpRequest *)this_00,&local_200);
    std::__cxx11::string::~string((string *)&local_200);
  }
  Json::Value::Value(&val,nullValue);
  Json::Reader::Reader(&reader);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_220,"Action",(allocator<char> *)&local_5c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_240,"CreateInstance",&local_5e1);
  AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_220,&local_240);
  std::__cxx11::string::~string((string *)&local_240);
  std::__cxx11::string::~string((string *)&local_220);
  if ((req->owner_id)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_260,"OwnerId",(allocator<char> *)&local_5c8);
    std::__cxx11::string::string((string *)&local_280,(string *)req);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_260,&local_280);
    std::__cxx11::string::~string((string *)&local_280);
    std::__cxx11::string::~string((string *)&local_260);
  }
  if ((req->resource_owner_account)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2a0,"ResourceOwnerAccount",(allocator<char> *)&local_5c8);
    std::__cxx11::string::string((string *)&local_2c0,(string *)&req->resource_owner_account);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_2a0,&local_2c0);
    std::__cxx11::string::~string((string *)&local_2c0);
    std::__cxx11::string::~string((string *)&local_2a0);
  }
  if ((req->resource_owner_id)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2e0,"ResourceOwnerId",(allocator<char> *)&local_5c8);
    std::__cxx11::string::string((string *)&local_300,(string *)&req->resource_owner_id);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_2e0,&local_300);
    std::__cxx11::string::~string((string *)&local_300);
    std::__cxx11::string::~string((string *)&local_2e0);
  }
  if ((req->owner_account)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_320,"OwnerAccount",(allocator<char> *)&local_5c8);
    std::__cxx11::string::string((string *)&local_340,(string *)&req->owner_account);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_320,&local_340);
    std::__cxx11::string::~string((string *)&local_340);
    std::__cxx11::string::~string((string *)&local_320);
  }
  if ((req->instance_name)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_360,"InstanceName",(allocator<char> *)&local_5c8);
    std::__cxx11::string::string((string *)&local_380,(string *)&req->instance_name);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_360,&local_380);
    std::__cxx11::string::~string((string *)&local_380);
    std::__cxx11::string::~string((string *)&local_360);
  }
  if ((req->password)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3a0,"Password",(allocator<char> *)&local_5c8);
    std::__cxx11::string::string((string *)&local_3c0,(string *)&req->password);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_3a0,&local_3c0);
    std::__cxx11::string::~string((string *)&local_3c0);
    std::__cxx11::string::~string((string *)&local_3a0);
  }
  if ((req->capacity)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3e0,"Capacity",(allocator<char> *)&local_5c8);
    std::__cxx11::string::string((string *)&local_400,(string *)&req->capacity);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_3e0,&local_400);
    std::__cxx11::string::~string((string *)&local_400);
    std::__cxx11::string::~string((string *)&local_3e0);
  }
  if ((req->zone_id)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_420,"ZoneId",(allocator<char> *)&local_5c8);
    std::__cxx11::string::string((string *)&local_440,(string *)&req->zone_id);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_420,&local_440);
    std::__cxx11::string::~string((string *)&local_440);
    std::__cxx11::string::~string((string *)&local_420);
  }
  if ((req->config)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_460,"Config",(allocator<char> *)&local_5c8);
    std::__cxx11::string::string((string *)&local_480,(string *)&req->config);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_460,&local_480);
    std::__cxx11::string::~string((string *)&local_480);
    std::__cxx11::string::~string((string *)&local_460);
  }
  if ((req->charge_type)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4a0,"ChargeType",(allocator<char> *)&local_5c8);
    std::__cxx11::string::string((string *)&local_4c0,(string *)&req->charge_type);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_4a0,&local_4c0);
    std::__cxx11::string::~string((string *)&local_4c0);
    std::__cxx11::string::~string((string *)&local_4a0);
  }
  if ((req->period)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4e0,"Period",(allocator<char> *)&local_5c8);
    std::__cxx11::string::string((string *)&local_500,(string *)&req->period);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_4e0,&local_500);
    std::__cxx11::string::~string((string *)&local_500);
    std::__cxx11::string::~string((string *)&local_4e0);
  }
  if ((req->token)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_520,"Token",(allocator<char> *)&local_5c8);
    std::__cxx11::string::string((string *)&local_540,(string *)&req->token);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_520,&local_540);
    std::__cxx11::string::~string((string *)&local_540);
    std::__cxx11::string::~string((string *)&local_520);
  }
  if ((this->region_id_ != (char *)0x0) && (*this->region_id_ != '\0')) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_560,"RegionId",(allocator<char> *)&local_5c8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_580,this->region_id_,&local_5e1);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_560,&local_580);
    std::__cxx11::string::~string((string *)&local_580);
    std::__cxx11::string::~string((string *)&local_560);
  }
  iVar2 = (**(this_00->super_AliHttpRequest)._vptr_AliHttpRequest)(this_00);
  if (iVar2 == 0) {
    iVar2 = AliHttpRequest::WaitResponseHeaderComplete((AliHttpRequest *)this_00);
    AliHttpRequest::ReadResponseBody((AliHttpRequest *)this_00,&str_response);
    if (((0 < iVar2) && (str_response._M_string_length != 0)) &&
       (bVar1 = Json::Reader::parse(&reader,&str_response,&val,true), bVar1)) {
      if (error_info != (RkvstoreErrorInfo *)0x0 && iVar2 != 200) {
        bVar1 = Json::Value::isMember(&val,"RequestId");
        if (bVar1) {
          pVVar4 = Json::Value::operator[](&val,"RequestId");
          Json::Value::asString_abi_cxx11_(&local_5c8,pVVar4);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_5c8,anon_var_dwarf_10cfee + 9,&local_5e1);
        }
        std::__cxx11::string::operator=((string *)error_info,(string *)&local_5c8);
        std::__cxx11::string::~string((string *)&local_5c8);
        bVar1 = Json::Value::isMember(&val,"Code");
        if (bVar1) {
          pVVar4 = Json::Value::operator[](&val,"Code");
          Json::Value::asString_abi_cxx11_(&local_5c8,pVVar4);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_5c8,anon_var_dwarf_10cfee + 9,&local_5a1);
        }
        std::__cxx11::string::operator=((string *)&error_info->code,(string *)&local_5c8);
        std::__cxx11::string::~string((string *)&local_5c8);
        bVar1 = Json::Value::isMember(&val,"HostId");
        if (bVar1) {
          pVVar4 = Json::Value::operator[](&val,"HostId");
          Json::Value::asString_abi_cxx11_(&local_5c8,pVVar4);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_5c8,anon_var_dwarf_10cfee + 9,&local_5a2);
        }
        std::__cxx11::string::operator=((string *)&error_info->host_id,(string *)&local_5c8);
        std::__cxx11::string::~string((string *)&local_5c8);
        bVar1 = Json::Value::isMember(&val,"Message");
        if (bVar1) {
          pVVar4 = Json::Value::operator[](&val,"Message");
          Json::Value::asString_abi_cxx11_(&local_5c8,pVVar4);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_5c8,anon_var_dwarf_10cfee + 9,&local_5a3);
        }
        std::__cxx11::string::operator=((string *)&error_info->message,(string *)&local_5c8);
        std::__cxx11::string::~string((string *)&local_5c8);
      }
      if (response != (RkvstoreCreateInstanceResponseType *)0x0 && iVar2 == 200) {
        bVar1 = Json::Value::isMember(&val,"InstanceId");
        if (bVar1) {
          pVVar4 = Json::Value::operator[](&val,"InstanceId");
          Json::Value::asString_abi_cxx11_(&local_5c8,pVVar4);
          std::__cxx11::string::operator=((string *)response,(string *)&local_5c8);
          std::__cxx11::string::~string((string *)&local_5c8);
        }
        bVar1 = Json::Value::isMember(&val,"InstanceName");
        if (bVar1) {
          pVVar4 = Json::Value::operator[](&val,"InstanceName");
          Json::Value::asString_abi_cxx11_(&local_5c8,pVVar4);
          std::__cxx11::string::operator=((string *)&response->instance_name,(string *)&local_5c8);
          std::__cxx11::string::~string((string *)&local_5c8);
        }
        bVar1 = Json::Value::isMember(&val,"ConnectionDomain");
        if (bVar1) {
          pVVar4 = Json::Value::operator[](&val,"ConnectionDomain");
          Json::Value::asString_abi_cxx11_(&local_5c8,pVVar4);
          std::__cxx11::string::operator=
                    ((string *)&response->connection_domain,(string *)&local_5c8);
          std::__cxx11::string::~string((string *)&local_5c8);
        }
        bVar1 = Json::Value::isMember(&val,"Port");
        if (bVar1) {
          pVVar4 = Json::Value::operator[](&val,"Port");
          IVar3 = Json::Value::asInt(pVVar4);
          response->port = IVar3;
        }
        bVar1 = Json::Value::isMember(&val,"UserName");
        if (bVar1) {
          pVVar4 = Json::Value::operator[](&val,"UserName");
          Json::Value::asString_abi_cxx11_(&local_5c8,pVVar4);
          std::__cxx11::string::operator=((string *)&response->user_name,(string *)&local_5c8);
          std::__cxx11::string::~string((string *)&local_5c8);
        }
        bVar1 = Json::Value::isMember(&val,"InstanceStatus");
        if (bVar1) {
          pVVar4 = Json::Value::operator[](&val,"InstanceStatus");
          Json::Value::asString_abi_cxx11_(&local_5c8,pVVar4);
          std::__cxx11::string::operator=((string *)&response->instance_status,(string *)&local_5c8)
          ;
          std::__cxx11::string::~string((string *)&local_5c8);
        }
        bVar1 = Json::Value::isMember(&val,"RegionId");
        if (bVar1) {
          pVVar4 = Json::Value::operator[](&val,"RegionId");
          Json::Value::asString_abi_cxx11_(&local_5c8,pVVar4);
          std::__cxx11::string::operator=((string *)&response->region_id,(string *)&local_5c8);
          std::__cxx11::string::~string((string *)&local_5c8);
        }
        bVar1 = Json::Value::isMember(&val,"Capacity");
        if (bVar1) {
          pVVar4 = Json::Value::operator[](&val,"Capacity");
          IVar3 = Json::Value::asInt(pVVar4);
          response->capacity = (long)IVar3;
        }
        bVar1 = Json::Value::isMember(&val,"QPS");
        if (bVar1) {
          pVVar4 = Json::Value::operator[](&val,"QPS");
          IVar3 = Json::Value::asInt(pVVar4);
          response->qp_s = (long)IVar3;
        }
        bVar1 = Json::Value::isMember(&val,"Bandwidth");
        if (bVar1) {
          pVVar4 = Json::Value::operator[](&val,"Bandwidth");
          IVar3 = Json::Value::asInt(pVVar4);
          response->bandwidth = (long)IVar3;
        }
        bVar1 = Json::Value::isMember(&val,"Connections");
        if (bVar1) {
          pVVar4 = Json::Value::operator[](&val,"Connections");
          IVar3 = Json::Value::asInt(pVVar4);
          response->connections = (long)IVar3;
        }
        bVar1 = Json::Value::isMember(&val,"ZoneId");
        if (bVar1) {
          pVVar4 = Json::Value::operator[](&val,"ZoneId");
          Json::Value::asString_abi_cxx11_(&local_5c8,pVVar4);
          std::__cxx11::string::operator=((string *)&response->zone_id,(string *)&local_5c8);
          std::__cxx11::string::~string((string *)&local_5c8);
        }
        bVar1 = Json::Value::isMember(&val,"Config");
        if (bVar1) {
          pVVar4 = Json::Value::operator[](&val,"Config");
          Json::Value::asString_abi_cxx11_(&local_5c8,pVVar4);
          std::__cxx11::string::operator=((string *)&response->config,(string *)&local_5c8);
          std::__cxx11::string::~string((string *)&local_5c8);
        }
        bVar1 = Json::Value::isMember(&val,"ChargeType");
        if (bVar1) {
          pVVar4 = Json::Value::operator[](&val,"ChargeType");
          Json::Value::asString_abi_cxx11_(&local_5c8,pVVar4);
          std::__cxx11::string::operator=((string *)&response->charge_type,(string *)&local_5c8);
          std::__cxx11::string::~string((string *)&local_5c8);
        }
        bVar1 = Json::Value::isMember(&val,"EndTime");
        iVar2 = 200;
        if (bVar1) {
          pVVar4 = Json::Value::operator[](&val,"EndTime");
          Json::Value::asString_abi_cxx11_(&local_5c8,pVVar4);
          std::__cxx11::string::operator=((string *)&response->end_time,(string *)&local_5c8);
          std::__cxx11::string::~string((string *)&local_5c8);
        }
      }
      goto LAB_0012d515;
    }
  }
  iVar2 = -1;
  if (error_info != (RkvstoreErrorInfo *)0x0) {
    std::__cxx11::string::assign((char *)&error_info->code);
  }
LAB_0012d515:
  AliRpcRequest::~AliRpcRequest(this_00);
  operator_delete(this_00,0x2c8);
  Json::Reader::~Reader(&reader);
  Json::Value::~Value(&val);
  std::__cxx11::string::~string((string *)&secheme);
  std::__cxx11::string::~string((string *)&str_response);
  return iVar2;
}

Assistant:

int Rkvstore::CreateInstance(const RkvstoreCreateInstanceRequestType& req,
                      RkvstoreCreateInstanceResponseType* response,
                       RkvstoreErrorInfo* error_info) {
  std::string str_response;
  int status_code;
  int ret = 0;
  bool parse_success = false;
  std::string secheme = this->use_tls_ ? "https" : "http";
  AliRpcRequest* req_rpc = new AliRpcRequest(version_,
                         appid_,
                         secret_,
                         secheme + "://" + host_);
  if((!this->use_tls_) && this->proxy_host_ && this->proxy_host_[0]) {
    req_rpc->SetHttpProxy( this->proxy_host_);
  }
  Json::Value val;
  Json::Reader reader;
  req_rpc->AddRequestQuery("Action","CreateInstance");
  if(!req.owner_id.empty()) {
    req_rpc->AddRequestQuery("OwnerId", req.owner_id);
  }
  if(!req.resource_owner_account.empty()) {
    req_rpc->AddRequestQuery("ResourceOwnerAccount", req.resource_owner_account);
  }
  if(!req.resource_owner_id.empty()) {
    req_rpc->AddRequestQuery("ResourceOwnerId", req.resource_owner_id);
  }
  if(!req.owner_account.empty()) {
    req_rpc->AddRequestQuery("OwnerAccount", req.owner_account);
  }
  if(!req.instance_name.empty()) {
    req_rpc->AddRequestQuery("InstanceName", req.instance_name);
  }
  if(!req.password.empty()) {
    req_rpc->AddRequestQuery("Password", req.password);
  }
  if(!req.capacity.empty()) {
    req_rpc->AddRequestQuery("Capacity", req.capacity);
  }
  if(!req.zone_id.empty()) {
    req_rpc->AddRequestQuery("ZoneId", req.zone_id);
  }
  if(!req.config.empty()) {
    req_rpc->AddRequestQuery("Config", req.config);
  }
  if(!req.charge_type.empty()) {
    req_rpc->AddRequestQuery("ChargeType", req.charge_type);
  }
  if(!req.period.empty()) {
    req_rpc->AddRequestQuery("Period", req.period);
  }
  if(!req.token.empty()) {
    req_rpc->AddRequestQuery("Token", req.token);
  }
  if(this->region_id_ && this->region_id_[0]) {
    req_rpc->AddRequestQuery("RegionId", this->region_id_);
  }
  if(req_rpc->CommitRequest() != 0) {
     if(error_info) {
       error_info->code = "connect to host failed";
     }
     ret = -1;
     goto out;
  }
  status_code = req_rpc->WaitResponseHeaderComplete();
  req_rpc->ReadResponseBody(str_response);
  if(status_code > 0 && !str_response.empty()){
    parse_success = reader.parse(str_response, val);
  }
  if(!parse_success) {
    if(error_info) {
      error_info->code = "parse response failed";
    }
    ret = -1;
    goto out;
  }
  if(status_code!= 200 && error_info && parse_success) {
    error_info->request_id = val.isMember("RequestId") ? val["RequestId"].asString(): "";
    error_info->code = val.isMember("Code") ? val["Code"].asString(): "";
    error_info->host_id = val.isMember("HostId") ? val["HostId"].asString(): "";
    error_info->message = val.isMember("Message") ? val["Message"].asString(): "";
  }
  if(status_code== 200 && response) {
    Json2Type(val, response);
  }
  ret = status_code;
out:
  delete req_rpc;
  return ret;
}